

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_restart.c
# Opt level: O0

PDHG_restart_choice PDHG_Check_Restart_GPU(CUPDLPwork *work)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  long in_RDI;
  cupdlp_float cVar4;
  cupdlp_float cVar5;
  cupdlp_float dPrimalFeas;
  cupdlp_float cVar6;
  cupdlp_float muLastCandidate;
  cupdlp_float muLastRestart;
  PDHG_restart_choice restart_choice;
  cupdlp_float muCandidate;
  cupdlp_float muAverage;
  cupdlp_float muCurrent;
  CUPDLPtimers *timers;
  CUPDLPresobj *resobj;
  CUPDLPiterates *iterates;
  CUPDLPstepsize *stepsize;
  CUPDLPdata *lp;
  CUPDLPproblem *problem;
  cupdlp_float in_stack_ffffffffffffff88;
  cupdlp_float in_stack_ffffffffffffff90;
  cupdlp_float in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  double local_58;
  PDHG_restart_choice local_4;
  
  lVar1 = *(long *)(in_RDI + 0x18);
  lVar2 = *(long *)(in_RDI + 0x10);
  piVar3 = *(int **)(in_RDI + 0x30);
  if (*piVar3 == *(int *)(lVar1 + 8)) {
    *(undefined8 *)(lVar2 + 0x150) = *(undefined8 *)(lVar2 + 0x28);
    *(undefined8 *)(lVar2 + 0x158) = *(undefined8 *)(lVar2 + 0x30);
    *(undefined8 *)(lVar2 + 0x160) = *(undefined8 *)(lVar2 + 0x18);
    *(undefined8 *)(lVar2 + 0x168) = *(undefined8 *)(lVar2 + 0x28);
    *(undefined8 *)(lVar2 + 0x170) = *(undefined8 *)(lVar2 + 0x30);
    *(undefined8 *)(lVar2 + 0x178) = *(undefined8 *)(lVar2 + 0x18);
    local_4 = PDHG_NO_RESTART;
  }
  else {
    cVar4 = PDHG_Restart_Score_GPU
                      ((cupdlp_float)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                      );
    cVar5 = PDHG_Restart_Score_GPU
                      ((cupdlp_float)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88
                      );
    local_4 = PDHG_RESTART_TO_AVERAGE;
    local_58 = cVar5;
    if (cVar4 < cVar5) {
      local_4 = PDHG_RESTART_TO_CURRENT;
      local_58 = cVar4;
    }
    if ((((double)(*piVar3 - *(int *)(lVar1 + 8)) < (double)*piVar3 * 0.36) &&
        (dPrimalFeas = PDHG_Restart_Score_GPU
                                 ((cupdlp_float)CONCAT44(local_4,in_stack_ffffffffffffffa0),
                                  in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                                  in_stack_ffffffffffffff88), dPrimalFeas * 0.2 <= local_58)) &&
       ((cVar6 = PDHG_Restart_Score_GPU
                           ((cupdlp_float)CONCAT44(local_4,in_stack_ffffffffffffffa0),dPrimalFeas,
                            in_stack_ffffffffffffff90,in_stack_ffffffffffffff88),
        dPrimalFeas * 0.8 <= local_58 || (local_58 <= cVar6)))) {
      local_4 = PDHG_NO_RESTART;
    }
    if (cVar5 <= cVar4) {
      *(undefined8 *)(lVar2 + 0x168) = *(undefined8 *)(lVar2 + 0x128);
      *(undefined8 *)(lVar2 + 0x170) = *(undefined8 *)(lVar2 + 0x130);
      *(undefined8 *)(lVar2 + 0x178) = *(undefined8 *)(lVar2 + 0x118);
    }
    else {
      *(undefined8 *)(lVar2 + 0x168) = *(undefined8 *)(lVar2 + 0x28);
      *(undefined8 *)(lVar2 + 0x170) = *(undefined8 *)(lVar2 + 0x30);
      *(undefined8 *)(lVar2 + 0x178) = *(undefined8 *)(lVar2 + 0x18);
    }
    if (local_4 != PDHG_NO_RESTART) {
      if (cVar5 <= cVar4) {
        if (1 < *(int *)(*(long *)(in_RDI + 8) + 0x38)) {
          printf("Last restart was iter %d: %s",(ulong)*(uint *)(lVar1 + 8),"average\n");
        }
      }
      else if (1 < *(int *)(*(long *)(in_RDI + 8) + 0x38)) {
        printf("Last restart was iter %d: %s",(ulong)*(uint *)(lVar1 + 8),"current\n");
      }
    }
  }
  return local_4;
}

Assistant:

PDHG_restart_choice PDHG_Check_Restart_GPU(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;
  CUPDLPresobj *resobj = work->resobj;
  CUPDLPtimers *timers = work->timers;

  // Is it first time called?
  if (timers->nIter == iterates->iLastRestartIter) {
    resobj->dPrimalFeasLastRestart = resobj->dPrimalFeas;
    resobj->dDualFeasLastRestart = resobj->dDualFeas;
    resobj->dDualityGapLastRestart = resobj->dDualityGap;

    resobj->dPrimalFeasLastCandidate = resobj->dPrimalFeas;
    resobj->dDualFeasLastCandidate = resobj->dDualFeas;
    resobj->dDualityGapLastCandidate = resobj->dDualityGap;

    return PDHG_NO_RESTART;
  }

  cupdlp_float muCurrent = PDHG_Restart_Score_GPU(
      work->stepsize->dBeta, work->resobj->dPrimalFeas, work->resobj->dDualFeas,
      work->resobj->dDualityGap);
  cupdlp_float muAverage = PDHG_Restart_Score_GPU(
      work->stepsize->dBeta, work->resobj->dPrimalFeasAverage,
      work->resobj->dDualFeasAverage, work->resobj->dDualityGapAverage);

  cupdlp_float muCandidate = 0.0;
  PDHG_restart_choice restart_choice = PDHG_RESTART_TO_AVERAGE;
  if (muCurrent < muAverage) {
    restart_choice = PDHG_RESTART_TO_CURRENT;
    muCandidate = muCurrent;
  } else {
    // restart_choice = PDHG_RESTART_TO_AVERAGE;
    muCandidate = muAverage;
  }

  // Or should we do artificial restart based on iteration count?
  // if (2 * (timers->nIter - iterates->iLastRestartIter) >= timers->nIter) {
  if ((timers->nIter - iterates->iLastRestartIter) >= 0.36 * timers->nIter) {
#if CUPDLP_DEBUG
    cupdlp_printf("Doing artificial restart.");
#endif
  } else {
    cupdlp_float muLastRestart = PDHG_Restart_Score_GPU(
        work->stepsize->dBeta, work->resobj->dPrimalFeasLastRestart,
        work->resobj->dDualFeasLastRestart,
        work->resobj->dDualityGapLastRestart);

    // Sufficient decay
    if (muCandidate < 0.2 * muLastRestart) {
#if CUPDLP_DEBUG
      cupdlp_printf("Doing sufficient restart.");
#endif
    } else {
      cupdlp_float muLastCandidate = PDHG_Restart_Score_GPU(
          work->stepsize->dBeta, work->resobj->dPrimalFeasLastCandidate,
          work->resobj->dDualFeasLastCandidate,
          work->resobj->dDualityGapLastCandidate);

      // Necessary decay
      if (muCandidate < 0.8 * muLastRestart && muCandidate > muLastCandidate) {
#if CUPDLP_DEBUG
        cupdlp_printf("Doing necessary restart.");
#endif
      } else {
        restart_choice = PDHG_NO_RESTART;
      }
    }
  }
  // record candidate
  if (muCurrent < muAverage) {
    resobj->dPrimalFeasLastCandidate = resobj->dPrimalFeas;
    resobj->dDualFeasLastCandidate = resobj->dDualFeas;
    resobj->dDualityGapLastCandidate = resobj->dDualityGap;
  } else {
    resobj->dPrimalFeasLastCandidate = resobj->dPrimalFeasAverage;
    resobj->dDualFeasLastCandidate = resobj->dDualFeasAverage;
    resobj->dDualityGapLastCandidate = resobj->dDualityGapAverage;
  }

  if (restart_choice != PDHG_NO_RESTART) {
    if (muCurrent < muAverage) {
        if (work->settings->nLogLevel > 1)
	  cupdlp_printf("Last restart was iter %d: %s", iterates->iLastRestartIter,
                    "current\n");
    } else {
        if (work->settings->nLogLevel > 1)
	  cupdlp_printf("Last restart was iter %d: %s", iterates->iLastRestartIter,
                    "average\n");
    }
  }
  return restart_choice;
}